

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O1

Value * __thiscall GlobOptBlockData::FindPropertyValue(GlobOptBlockData *this,SymID symId)

{
  code *pcVar1;
  bool bVar2;
  BOOLEAN BVar3;
  Sym *pSVar4;
  undefined4 *puVar5;
  Value **ppVVar6;
  
  pSVar4 = SymTable::Find(this->globOpt->func->m_symTable,symId);
  if (pSVar4->m_kind != SymKindProperty) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                       ,0x520,"(this->globOpt->func->m_symTable->Find(symId)->IsPropertySym())",
                       "this->globOpt->func->m_symTable->Find(symId)->IsPropertySym()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  BVar3 = BVSparse<Memory::JitArenaAllocator>::Test(this->liveFields,symId);
  if ((BVar3 != '\0') &&
     (ppVVar6 = ValueHashTable<Sym_*,_Value_*>::Get(this->symToValueMap,symId),
     ppVVar6 != (Value **)0x0)) {
    return *ppVVar6;
  }
  return (Value *)0x0;
}

Assistant:

Value *
GlobOptBlockData::FindPropertyValue(SymID symId)
{
    Assert(this->globOpt->func->m_symTable->Find(symId)->IsPropertySym());
    if (!this->liveFields->Test(symId))
    {
        return nullptr;
    }
    return FindValueFromMapDirect(symId);
}